

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O2

void __thiscall InputGraph::set_vertex_label(InputGraph *this,int v,string_view l)

{
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = l._M_str;
  local_28._M_len = l._M_len;
  name._M_str = "vertex label";
  name._M_len = (size_t)local_28._M_str;
  anon_unknown.dwarf_34141::sanity_check_name
            ((anon_unknown_dwarf_34141 *)local_28._M_len,name,local_28._M_str);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             ((long)v * 0x20 +
             *(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                         .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->
                       vertex_labels).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ),&local_28);
  return;
}

Assistant:

auto InputGraph::set_vertex_label(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex label");
    _imp->vertex_labels[v] = l;
}